

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkUniversal::IntStateScatterReactions
          (ChLinkUniversal *this,uint off_L,ChVectorDynamic<> *L)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  double *pdVar33;
  ChBodyFrame *pCVar34;
  double dVar35;
  int iVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ChMatrix33<double> mat2;
  ChMatrix33<double> *local_70;
  ChMatrix33<double> *local_68;
  ChMatrix33<double> local_60;
  
  iVar36 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])()
  ;
  if ((char)iVar36 == '\0') {
    return;
  }
  lVar32 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)off_L < lVar32) {
    pdVar33 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = pdVar33[off_L];
    this->m_multipliers[0] = pdVar33[off_L];
    if ((long)(ulong)(off_L + 1) < lVar32) {
      dVar43 = pdVar33[off_L + 1];
      this->m_multipliers[1] = dVar43;
      if ((long)(ulong)(off_L + 2) < lVar32) {
        auVar50._8_8_ = 0;
        auVar50._0_8_ = pdVar33[off_L + 2];
        this->m_multipliers[2] = pdVar33[off_L + 2];
        if ((long)(ulong)(off_L + 3) < lVar32) {
          dVar1 = pdVar33[off_L + 3];
          this->m_multipliers[3] = dVar1;
          pCVar34 = (this->super_ChLink).Body2;
          local_70 = &(pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[2];
          auVar55._8_8_ = 0;
          auVar55._0_8_ =
               dVar43 * (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[5];
          auVar2 = vfmadd231sd_fma(auVar55,auVar37,auVar2);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[8];
          auVar2 = vfmadd231sd_fma(auVar2,auVar50,auVar3);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[0];
          auVar59._8_8_ = 0;
          auVar59._0_8_ =
               dVar43 * (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[3];
          auVar3 = vfmadd231sd_fma(auVar59,auVar37,auVar4);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[6];
          auVar3 = vfmadd231sd_fma(auVar3,auVar50,auVar5);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[1];
          auVar44._8_8_ = 0;
          auVar44._0_8_ =
               dVar43 * (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[4];
          auVar37 = vfmadd231sd_fma(auVar44,auVar37,auVar6);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[7];
          auVar37 = vfmadd231sd_fma(auVar37,auVar50,auVar7);
          dVar43 = auVar37._0_8_;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[2];
          auVar38._8_8_ = 0;
          auVar38._0_8_ =
               dVar43 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[5];
          auVar37 = vfmadd231sd_fma(auVar38,auVar3,auVar8);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[8];
          auVar37 = vfmadd231sd_fma(auVar37,auVar2,auVar9);
          auVar10._8_8_ = 0;
          auVar10._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          auVar51._8_8_ = 0;
          auVar51._0_8_ =
               dVar43 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[4];
          auVar50 = vfmadd231sd_fma(auVar51,auVar3,auVar10);
          auVar11._8_8_ = 0;
          auVar11._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
          auVar50 = vfmadd231sd_fma(auVar50,auVar2,auVar11);
          auVar12._8_8_ = 0;
          auVar12._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          auVar45._8_8_ = 0;
          auVar45._0_8_ =
               dVar43 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[3];
          auVar3 = vfmadd231sd_fma(auVar45,auVar3,auVar12);
          auVar13._8_8_ = 0;
          auVar13._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
          auVar2 = vfmadd231sd_fma(auVar3,auVar2,auVar13);
          (this->super_ChLink).react_force.m_data[0] = auVar2._0_8_;
          (this->super_ChLink).react_force.m_data[1] = auVar50._0_8_;
          (this->super_ChLink).react_force.m_data[2] = auVar37._0_8_;
          pCVar34 = (this->super_ChLink).Body1;
          auVar39._8_8_ = 0;
          auVar39._0_8_ =
               (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          dVar43 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          auVar52._8_8_ = 0;
          auVar52._0_8_ =
               (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
          auVar14._8_8_ = 0;
          auVar14._0_8_ =
               (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
          auVar56._8_8_ = 0;
          auVar56._0_8_ =
               dVar43 * (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[7];
          auVar37 = vfmadd231sd_fma(auVar56,auVar39,auVar14);
          auVar15._8_8_ = 0;
          auVar15._0_8_ =
               (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
          auVar37 = vfmadd231sd_fma(auVar37,auVar52,auVar15);
          auVar16._8_8_ = 0;
          auVar16._0_8_ =
               (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          auVar57._8_8_ = 0;
          auVar57._0_8_ =
               dVar43 * (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[1];
          auVar50 = vfmadd231sd_fma(auVar57,auVar39,auVar16);
          auVar17._8_8_ = 0;
          auVar17._0_8_ =
               (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          auVar50 = vfmadd231sd_fma(auVar50,auVar52,auVar17);
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar46._8_8_ = 0;
          auVar46._0_8_ =
               dVar43 * (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[4];
          auVar2 = vfmadd231sd_fma(auVar46,auVar39,auVar18);
          auVar19._8_8_ = 0;
          auVar19._0_8_ =
               (pCVar34->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
          auVar2 = vfmadd231sd_fma(auVar2,auVar52,auVar19);
          local_68 = &this->m_v2_tilde;
          ChMatrix33<double>::
          ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                    (&local_60,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                      *)&local_70);
          dVar43 = dVar1 * auVar37._0_8_;
          dVar35 = dVar1 * auVar50._0_8_;
          dVar1 = dVar1 * auVar2._0_8_;
          auVar20._8_8_ = 0;
          auVar20._0_8_ =
               local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar35;
          auVar58._8_8_ = 0;
          auVar58._0_8_ =
               dVar1 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5];
          auVar37 = vfmadd231sd_fma(auVar58,auVar47,auVar20);
          auVar21._8_8_ = 0;
          auVar21._0_8_ =
               local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = dVar43;
          auVar37 = vfmadd231sd_fma(auVar37,auVar40,auVar21);
          auVar22._8_8_ = 0;
          auVar22._0_8_ =
               local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          auVar60._8_8_ = 0;
          auVar60._0_8_ =
               dVar1 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[3];
          auVar50 = vfmadd231sd_fma(auVar60,auVar47,auVar22);
          auVar23._8_8_ = 0;
          auVar23._0_8_ =
               local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
          auVar50 = vfmadd231sd_fma(auVar50,auVar40,auVar23);
          auVar24._8_8_ = 0;
          auVar24._0_8_ =
               local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          auVar48._8_8_ = 0;
          auVar48._0_8_ = dVar35;
          auVar53._8_8_ = 0;
          auVar53._0_8_ =
               dVar1 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[4];
          auVar2 = vfmadd231sd_fma(auVar53,auVar48,auVar24);
          auVar25._8_8_ = 0;
          auVar25._0_8_ =
               local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = dVar43;
          auVar2 = vfmadd231sd_fma(auVar2,auVar41,auVar25);
          dVar43 = auVar2._0_8_;
          auVar26._8_8_ = 0;
          auVar26._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          auVar42._8_8_ = 0;
          auVar42._0_8_ =
               dVar43 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[5];
          auVar2 = vfnmsub231sd_fma(auVar42,auVar50,auVar26);
          auVar27._8_8_ = 0;
          auVar27._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
          auVar2 = vfnmadd231sd_fma(auVar2,auVar37,auVar27);
          auVar28._8_8_ = 0;
          auVar28._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          auVar49._8_8_ = 0;
          auVar49._0_8_ =
               dVar43 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[4];
          auVar3 = vfnmsub231sd_fma(auVar49,auVar50,auVar28);
          auVar29._8_8_ = 0;
          auVar29._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
          auVar3 = vfnmadd231sd_fma(auVar3,auVar37,auVar29);
          auVar30._8_8_ = 0;
          auVar30._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          auVar54._8_8_ = 0;
          auVar54._0_8_ =
               dVar43 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[3];
          auVar50 = vfnmsub231sd_fma(auVar54,auVar50,auVar30);
          auVar31._8_8_ = 0;
          auVar31._0_8_ =
               (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
          auVar37 = vfnmadd231sd_fma(auVar50,auVar37,auVar31);
          (this->super_ChLink).react_torque.m_data[0] = auVar37._0_8_;
          (this->super_ChLink).react_torque.m_data[1] = auVar3._0_8_;
          (this->super_ChLink).react_torque.m_data[2] = auVar2._0_8_;
          return;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkUniversal::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    m_multipliers[0] = L(off_L + 0);
    m_multipliers[1] = L(off_L + 1);
    m_multipliers[2] = L(off_L + 2);
    m_multipliers[3] = L(off_L + 3);

    // Also compute 'intuitive' reactions:

    // Extract the Lagrange multipliers for the 3 spherical constraints and for
    // the dot constraint.
    ChVector<> lam_sph(m_multipliers[0], m_multipliers[1], m_multipliers[2]);
    double lam_dot = m_multipliers[3];

    // Calculate the reaction force and torque acting on the 2nd body at the joint
    // location, expressed in the joint reference frame.  Taking into account the
    // sign with which Lagrange multipliers show up in the EOM in Chrono, we get:
    //   F = C^T * A_2^T * Phi_r2^T * lam
    //   T = C^T * ( Phi_pi2^T - tilde(s2') * A_2^T * Phi_r2^T ) * lam
    // For the universal joint, after some manipulations, we have:
    //   F = C^T * A_2^T * lam_sph
    //   T = C^T * tilde(v2') *A_2^T * u1 * lam_dot
    //     = -C^T * [A_2 * tilde(v2')]^T * u1 * lam_dot

    // Reaction force
    ChVector<> F2 = Body2->GetA().transpose() * lam_sph;
    react_force = m_frame2.GetA().transpose() * F2;

    // Reaction torque
    ChVector<> u1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Xaxis());
    ChMatrix33<> mat2 = Body2->GetA() * m_v2_tilde;
    ChVector<> T2 = mat2.transpose() * (lam_dot * u1);
    react_torque = m_frame2.GetA().transpose() * (-T2);
}